

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseSimdConst
          (WastParser *this,Const *const_,Type in_type,int32_t nSimdConstBytes)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Literal *pLVar2;
  const_iterator s_00;
  char *format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  Result local_174;
  const_iterator pcStack_170;
  Result result;
  char *end;
  char *s;
  string_view sv;
  undefined1 local_100 [8];
  Literal literal;
  allocator local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  iterator local_98;
  size_type local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 auStack_70 [8];
  Location loc;
  int i;
  int Count;
  size_type local_40;
  anon_union_16_2_ecfd7102_for_Location_1 local_38;
  int local_28;
  Type local_24;
  int32_t nSimdConstBytes_local;
  Type in_type_local;
  Const *const__local;
  WastParser *this_local;
  
  local_28 = nSimdConstBytes;
  local_24 = in_type;
  _nSimdConstBytes_local = const_;
  const__local = (Const *)this;
  if (in_type == I32) {
    GetLocation((Location *)&i,this);
    (_nSimdConstBytes_local->loc).filename.data_ = _i;
    (_nSimdConstBytes_local->loc).filename.size_ = local_40;
    (_nSimdConstBytes_local->loc).field_1.field_1.offset = (size_t)local_38.field_1.offset;
    *(undefined8 *)((long)&(_nSimdConstBytes_local->loc).field_1 + 8) = local_38._8_8_;
    loc.field_1._12_4_ = (undefined4)((ulong)(long)local_28 >> 2);
    for (loc.field_1.field_0.last_column = 0;
        loc.field_1.field_0.last_column < (int)loc.field_1._12_4_;
        loc.field_1.field_0.last_column = loc.field_1.field_0.last_column + 1) {
      GetLocation((Location *)auStack_70,this);
      bVar1 = PeekMatch(this,Last_Literal);
      if (!bVar1) {
        literal.text.field_2._M_local_buf[0xb] = '\x01';
        local_c0 = &local_b8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b8,"an Nat literal",&local_c1);
        literal.text.field_2._M_local_buf[0xb] = '\0';
        local_98 = &local_b8;
        local_90 = 1;
        this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(literal.text.field_2._M_local_buf + 10);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(this_00);
        __l._M_len = local_90;
        __l._M_array = local_98;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_88,__l,this_00);
        this_local._4_4_ = ErrorExpected(this,&local_88,"123");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(literal.text.field_2._M_local_buf + 10));
        local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98;
        do {
          local_200 = local_200 + -1;
          std::__cxx11::string::~string((string *)local_200);
        } while (local_200 != &local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        return (Result)this_local._4_4_;
      }
      Consume((Token *)&sv.size_,this);
      pLVar2 = Token::literal((Token *)&sv.size_);
      Literal::Literal((Literal *)local_100,pLVar2);
      Token::~Token((Token *)&sv.size_);
      string_view::string_view((string_view *)&s,(string *)&literal);
      s_00 = string_view::begin((string_view *)&s);
      pcStack_170 = string_view::end((string_view *)&s);
      Result::Result(&local_174);
      local_174 = ParseInt32(s_00,pcStack_170,
                             (uint32_t *)
                             ((long)&_nSimdConstBytes_local->field_2 +
                             (long)loc.field_1.field_0.last_column * 4),SignedAndUnsigned);
      bVar1 = Failed(local_174);
      if (bVar1) {
        format = (char *)std::__cxx11::string::c_str((string *)&literal);
        Error(this,0x19b5078,format);
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      Literal::~Literal((Literal *)local_100);
      if (bVar1) {
        return (Result)this_local._4_4_;
      }
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    Error(this,0x19b508d);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseSimdConst(Const* const_,
                                  Type in_type,
                                  int32_t nSimdConstBytes) {
  WABT_TRACE(ParseSimdConst);

  // Parse the Simd Consts according to input data type.
  switch (in_type) {
    case Type::I32: {
      const_->loc = GetLocation();
      int Count = nSimdConstBytes / sizeof(uint32_t);
      // Meet expected "i32" token. start parse 4 i32 consts
      for (int i = 0; i < Count; i++) {
        Location loc = GetLocation();

        // Expected one 0xXXXXXXXX number
        if (!PeekMatch(TokenType::Nat))
          return ErrorExpected({"an Nat literal"}, "123");

        Literal literal = Consume().literal();

        string_view sv = literal.text;
        const char* s = sv.begin();
        const char* end = sv.end();
        Result result;

        result = ParseInt32(s, end, &(const_->v128_bits.v[i]),
                            ParseIntType::SignedAndUnsigned);

        if (Failed(result)) {
          Error(loc, "invalid literal \"%s\"", literal.text.c_str());
          return Result::Error;
        }
      }
      break;
    }

    default:
      Error(const_->loc, "Expected i32 at start of simd constant");
      return Result::Error;
  }

  return Result::Ok;
}